

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan.c
# Opt level: O2

VkResult glfwCreateWindowSurface
                   (VkInstance_conflict instance,GLFWwindow *handle,VkAllocationCallbacks *allocator
                   ,VkSurfaceKHR_conflict *surface)

{
  GLFWbool GVar1;
  VkResult VVar2;
  
  if (instance == (VkInstance_conflict)0x0) {
    __assert_fail("instance != VK_NULL_HANDLE",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/glfw/src/vulkan.c"
                  ,0x131,
                  "VkResult glfwCreateWindowSurface(VkInstance, GLFWwindow *, const VkAllocationCallbacks *, VkSurfaceKHR *)"
                 );
  }
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/glfw/src/vulkan.c"
                  ,0x132,
                  "VkResult glfwCreateWindowSurface(VkInstance, GLFWwindow *, const VkAllocationCallbacks *, VkSurfaceKHR *)"
                 );
  }
  if (surface == (VkSurfaceKHR_conflict *)0x0) {
    __assert_fail("surface != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/glfw/src/vulkan.c"
                  ,0x133,
                  "VkResult glfwCreateWindowSurface(VkInstance, GLFWwindow *, const VkAllocationCallbacks *, VkSurfaceKHR *)"
                 );
  }
  *surface = 0;
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    GVar1 = _glfwInitVulkan(2);
    if (GVar1 != 0) {
      if (_glfw.vk.extensions[0] == (char *)0x0) {
        _glfwInputError(0x10006,"Vulkan: Window surface creation extensions not found");
        return VK_ERROR_EXTENSION_NOT_PRESENT;
      }
      if (*(int *)(handle + 0x200) != 0) {
        _glfwInputError(0x10004,
                        "Vulkan: Window surface creation requires the window to have the client API set to GLFW_NO_API"
                       );
        return VK_ERROR_NATIVE_WINDOW_IN_USE_KHR;
      }
      VVar2 = _glfwPlatformCreateWindowSurface(instance,(_GLFWwindow *)handle,allocator,surface);
      return VVar2;
    }
  }
  return VK_ERROR_INITIALIZATION_FAILED;
}

Assistant:

GLFWAPI VkResult glfwCreateWindowSurface(VkInstance instance,
                                         GLFWwindow* handle,
                                         const VkAllocationCallbacks* allocator,
                                         VkSurfaceKHR* surface)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(instance != VK_NULL_HANDLE);
    assert(window != NULL);
    assert(surface != NULL);

    *surface = VK_NULL_HANDLE;

    _GLFW_REQUIRE_INIT_OR_RETURN(VK_ERROR_INITIALIZATION_FAILED);

    if (!_glfwInitVulkan(_GLFW_REQUIRE_LOADER))
        return VK_ERROR_INITIALIZATION_FAILED;

    if (!_glfw.vk.extensions[0])
    {
        _glfwInputError(GLFW_API_UNAVAILABLE,
                        "Vulkan: Window surface creation extensions not found");
        return VK_ERROR_EXTENSION_NOT_PRESENT;
    }

    if (window->context.client != GLFW_NO_API)
    {
        _glfwInputError(GLFW_INVALID_VALUE,
                        "Vulkan: Window surface creation requires the window to have the client API set to GLFW_NO_API");
        return VK_ERROR_NATIVE_WINDOW_IN_USE_KHR;
    }

    return _glfwPlatformCreateWindowSurface(instance, window, allocator, surface);
}